

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O2

QcSocket * qc_socket_create(int family,int type,int protocol)

{
  int iVar1;
  QcSocket *__ptr;
  
  __ptr = (QcSocket *)malloc(4);
  if (__ptr != (QcSocket *)0x0) {
    iVar1 = socket(family,type,protocol);
    __ptr->sockfd = iVar1;
    if (iVar1 < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x42,"socket create failed");
      free(__ptr);
      __ptr = (QcSocket *)0x0;
    }
    return __ptr;
  }
  fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
          ,0x3d);
  __assert_fail("sock",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x3d,"QcSocket *qc_socket_create(int, int, int)");
}

Assistant:

QcSocket* qc_socket_create(int family, int type, int protocol)
{
    QcSocket *sock;

    qc_malloc(sock, sizeof(QcSocket));

    sock->sockfd = (int)socket(family, type, protocol);
    if(sock->sockfd < 0)
    {
        qc_error("socket create failed");
        qc_free(sock);
        return NULL;
    }

    return sock;
}